

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  BVH *bvh;
  long lVar3;
  size_t k;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  undefined8 unaff_RBP;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar24;
  float fVar25;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar29 [16];
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  vfloat4 a0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar50;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  Precalculations pre;
  TravRayK<4,_false> tray;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    iVar7 = (valid_i->field_0).i[0];
    iVar8 = (valid_i->field_0).i[1];
    iVar9 = (valid_i->field_0).i[2];
    iVar10 = (valid_i->field_0).i[3];
    auVar17._0_4_ = -(uint)(iVar7 == -1);
    auVar17._4_4_ = -(uint)(iVar8 == -1);
    auVar17._8_4_ = -(uint)(iVar9 == -1);
    auVar17._12_4_ = -(uint)(iVar10 == -1);
    iVar13 = movmskps((int)unaff_RBP,auVar17);
    uVar14 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),iVar13);
    if (iVar13 != 0) {
      auVar17 = *(undefined1 (*) [16])(ray + 0x40);
      fVar38 = auVar17._0_4_;
      fVar41 = auVar17._4_4_;
      fVar42 = auVar17._8_4_;
      fVar43 = auVar17._12_4_;
      auVar1 = *(undefined1 (*) [16])(ray + 0x50);
      fVar33 = auVar1._0_4_;
      fVar35 = auVar1._4_4_;
      fVar36 = auVar1._8_4_;
      fVar37 = auVar1._12_4_;
      auVar2 = *(undefined1 (*) [16])(ray + 0x60);
      fVar28 = auVar2._0_4_;
      fVar30 = auVar2._4_4_;
      fVar31 = auVar2._8_4_;
      fVar32 = auVar2._12_4_;
      auVar27._0_4_ = fVar33 * fVar33 + fVar28 * fVar28;
      auVar27._4_4_ = fVar35 * fVar35 + fVar30 * fVar30;
      auVar27._8_4_ = fVar36 * fVar36 + fVar31 * fVar31;
      auVar27._12_4_ = fVar37 * fVar37 + fVar32 * fVar32;
      auVar45._0_4_ = fVar38 * fVar38 + auVar27._0_4_;
      auVar45._4_4_ = fVar41 * fVar41 + auVar27._4_4_;
      auVar45._8_4_ = fVar42 * fVar42 + auVar27._8_4_;
      auVar45._12_4_ = fVar43 * fVar43 + auVar27._12_4_;
      auVar27 = rsqrtps(auVar27,auVar45);
      fVar44 = auVar27._0_4_;
      fVar15 = auVar27._4_4_;
      fVar16 = auVar27._8_4_;
      fVar24 = auVar27._12_4_;
      pre.depth_scale.field_0.v[0] = fVar44 * fVar44 * auVar45._0_4_ * -0.5 * fVar44 + fVar44 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar15 * fVar15 * auVar45._4_4_ * -0.5 * fVar15 + fVar15 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar16 * fVar16 * auVar45._8_4_ * -0.5 * fVar16 + fVar16 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar24 * fVar24 * auVar45._12_4_ * -0.5 * fVar24 + fVar24 * 1.5
      ;
      uVar12 = uVar14;
      while (uVar12 != 0) {
        lVar3 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        auVar45 = insertps(ZEXT416(*(uint *)(ray + lVar3 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar3 * 4 + 0x50),0x1c);
        auVar45 = insertps(auVar45,*(undefined4 *)(ray + lVar3 * 4 + 0x60),0x28);
        fVar44 = *(float *)((long)pre.ray_space + lVar3 * 4 + -0x10);
        auVar46._0_4_ = auVar45._0_4_ * fVar44;
        auVar46._4_4_ = auVar45._4_4_ * fVar44;
        auVar46._8_4_ = auVar45._8_4_ * fVar44;
        auVar46._12_4_ = auVar45._12_4_ * fVar44;
        uVar11 = CONCAT44(auVar46._4_4_,auVar46._4_4_);
        auVar18._0_8_ = uVar11 ^ 0x8000000080000000;
        auVar18._8_4_ = -auVar46._12_4_;
        auVar18._12_4_ = -auVar46._12_4_;
        auVar45 = blendps(auVar18,ZEXT816(0),0xe);
        auVar5._4_4_ = auVar45._0_4_;
        auVar5._0_4_ = auVar46._8_4_;
        auVar5._8_4_ = auVar45._4_4_;
        auVar5._12_4_ = 0;
        auVar6._4_4_ = auVar45._0_4_;
        auVar6._0_4_ = auVar46._8_4_;
        auVar6._8_4_ = auVar45._4_4_;
        auVar6._12_4_ = 0;
        auVar54 = dpps(auVar6 << 0x20,auVar5 << 0x20,0x7f);
        uVar11 = CONCAT44(auVar46._12_4_,auVar46._8_4_);
        auVar48._0_8_ = uVar11 ^ 0x8000000080000000;
        auVar48._8_4_ = -auVar46._8_4_;
        auVar48._12_4_ = -auVar46._12_4_;
        auVar27 = insertps(auVar48,auVar46,0x2a);
        auVar45 = dpps(auVar27,auVar27,0x7f);
        iVar13 = -(uint)(auVar45._0_4_ < auVar54._0_4_);
        auVar19._4_4_ = iVar13;
        auVar19._0_4_ = iVar13;
        auVar19._8_4_ = iVar13;
        auVar19._12_4_ = iVar13;
        auVar45 = blendvps(auVar27,auVar5 << 0x20,auVar19);
        auVar27 = dpps(auVar45,auVar45,0x7f);
        auVar54 = rsqrtss(auVar27,auVar27);
        fVar15 = auVar54._0_4_;
        fVar15 = fVar15 * 1.5 - fVar15 * fVar15 * auVar27._0_4_ * 0.5 * fVar15;
        fVar16 = fVar15 * auVar45._0_4_;
        fVar24 = fVar15 * auVar45._4_4_;
        fVar25 = fVar15 * auVar45._8_4_;
        fVar15 = fVar15 * auVar45._12_4_;
        fVar47 = fVar24 * auVar46._0_4_ - auVar46._4_4_ * fVar16;
        fVar51 = fVar25 * auVar46._4_4_ - auVar46._8_4_ * fVar24;
        fVar52 = fVar16 * auVar46._8_4_ - auVar46._0_4_ * fVar25;
        auVar49._12_4_ = fVar15 * auVar46._12_4_ - auVar46._12_4_ * fVar15;
        auVar49._0_8_ = CONCAT44(fVar52,fVar51);
        auVar49._8_4_ = fVar47;
        auVar53._8_4_ = fVar47;
        auVar53._0_8_ = auVar49._0_8_;
        auVar53._12_4_ = auVar49._12_4_;
        auVar45 = dpps(auVar53,auVar49,0x7f);
        uVar12 = uVar12 & uVar12 - 1;
        auVar27 = rsqrtss(auVar45,auVar45);
        fVar15 = auVar27._0_4_;
        fVar15 = fVar15 * 1.5 - fVar15 * fVar15 * auVar45._0_4_ * 0.5 * fVar15;
        aVar20.m128[1] = fVar15 * fVar47;
        aVar20.m128[0] = fVar25;
        aVar20.m128[2] = auVar46._8_4_ * fVar44;
        aVar20.m128[3] = 0.0;
        aVar50.m128[1] = fVar15 * fVar51;
        aVar50.m128[0] = fVar16;
        aVar50.m128[2] = auVar46._0_4_ * fVar44;
        aVar50.m128[3] = 0.0;
        pre.ray_space[lVar3].vx.field_0 = aVar50;
        aVar4.m128[1] = fVar15 * fVar52;
        aVar4.m128[0] = fVar24;
        aVar4.m128[2] = auVar46._4_4_ * fVar44;
        aVar4.m128[3] = 0.0;
        pre.ray_space[lVar3].vy.field_0 = aVar4;
        pre.ray_space[lVar3].vz.field_0 = aVar20;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar44 = (float)DAT_01f4bd50;
      fVar15 = DAT_01f4bd50._4_4_;
      fVar16 = DAT_01f4bd50._8_4_;
      fVar24 = DAT_01f4bd50._12_4_;
      auVar54._4_4_ = -(uint)(ABS(fVar41) < fVar15);
      auVar54._0_4_ = -(uint)(ABS(fVar38) < fVar44);
      auVar54._8_4_ = -(uint)(ABS(fVar42) < fVar16);
      auVar54._12_4_ = -(uint)(ABS(fVar43) < fVar24);
      auVar39 = blendvps(auVar17,_DAT_01f4bd50,auVar54);
      auVar21._4_4_ = -(uint)(ABS(fVar35) < fVar15);
      auVar21._0_4_ = -(uint)(ABS(fVar33) < fVar44);
      auVar21._8_4_ = -(uint)(ABS(fVar36) < fVar16);
      auVar21._12_4_ = -(uint)(ABS(fVar37) < fVar24);
      auVar54 = blendvps(auVar1,_DAT_01f4bd50,auVar21);
      auVar22._4_4_ = -(uint)(ABS(fVar30) < fVar15);
      auVar22._0_4_ = -(uint)(ABS(fVar28) < fVar44);
      auVar22._8_4_ = -(uint)(ABS(fVar31) < fVar16);
      auVar22._12_4_ = -(uint)(ABS(fVar32) < fVar24);
      auVar27 = blendvps(auVar2,_DAT_01f4bd50,auVar22);
      auVar26._0_4_ = -(uint)(iVar7 == -1);
      auVar26._4_4_ = -(uint)(iVar8 == -1);
      auVar26._8_4_ = -(uint)(iVar9 == -1);
      auVar26._12_4_ = -(uint)(iVar10 == -1);
      auVar45 = rcpps(auVar22,auVar39);
      fVar44 = auVar45._0_4_;
      auVar40._0_4_ = auVar39._0_4_ * fVar44;
      fVar15 = auVar45._4_4_;
      auVar40._4_4_ = auVar39._4_4_ * fVar15;
      fVar16 = auVar45._8_4_;
      auVar40._8_4_ = auVar39._8_4_ * fVar16;
      fVar24 = auVar45._12_4_;
      auVar40._12_4_ = auVar39._12_4_ * fVar24;
      tray.rdir.field_0._0_4_ = (1.0 - auVar40._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._4_4_ = (1.0 - auVar40._4_4_) * fVar15 + fVar15;
      tray.rdir.field_0._8_4_ = (1.0 - auVar40._8_4_) * fVar16 + fVar16;
      tray.rdir.field_0._12_4_ = (1.0 - auVar40._12_4_) * fVar24 + fVar24;
      auVar45 = rcpps(auVar40,auVar54);
      fVar44 = auVar45._0_4_;
      auVar34._0_4_ = auVar54._0_4_ * fVar44;
      fVar15 = auVar45._4_4_;
      auVar34._4_4_ = auVar54._4_4_ * fVar15;
      fVar16 = auVar45._8_4_;
      auVar34._8_4_ = auVar54._8_4_ * fVar16;
      fVar24 = auVar45._12_4_;
      auVar34._12_4_ = auVar54._12_4_ * fVar24;
      tray.rdir.field_0._16_4_ = (1.0 - auVar34._0_4_) * fVar44 + fVar44;
      tray.rdir.field_0._20_4_ = (1.0 - auVar34._4_4_) * fVar15 + fVar15;
      tray.rdir.field_0._24_4_ = (1.0 - auVar34._8_4_) * fVar16 + fVar16;
      tray.rdir.field_0._28_4_ = (1.0 - auVar34._12_4_) * fVar24 + fVar24;
      auVar45 = rcpps(auVar34,auVar27);
      fVar44 = auVar45._0_4_;
      fVar15 = auVar45._4_4_;
      fVar16 = auVar45._8_4_;
      fVar24 = auVar45._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar27._0_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._36_4_ = (1.0 - auVar27._4_4_ * fVar15) * fVar15 + fVar15;
      tray.rdir.field_0._40_4_ = (1.0 - auVar27._8_4_ * fVar16) * fVar16 + fVar16;
      tray.rdir.field_0._44_4_ = (1.0 - auVar27._12_4_ * fVar24) * fVar24 + fVar24;
      auVar29._0_12_ = ZEXT812(0);
      auVar29._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar39._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar39._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar39._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar39._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar39);
      auVar23._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar23._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar23._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar23._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar23);
      auVar45 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a30,auVar45,auVar26);
      auVar45 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar45,auVar26);
      tray.dir.field_0._0_16_ = auVar17;
      tray.dir.field_0._16_16_ = auVar1;
      tray.dir.field_0._32_16_ = auVar2;
      for (; uVar14 != 0; uVar14 = uVar14 & uVar14 - 1) {
        k = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> k & 1) == 0; k = k + 1) {
          }
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,&pre,ray,&tray,context);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }